

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NutDecompiler.cpp
# Opt level: O0

ExpressionPtr * __thiscall VMState::AtStack(VMState *this,int64_t pos)

{
  size_type sVar1;
  Error *this_00;
  reference pvVar2;
  int64_t pos_local;
  VMState *this_local;
  
  if (-1 < pos) {
    sVar1 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::size
                      (&this->m_Stack);
    if ((ulong)pos < sVar1) {
      pvVar2 = std::vector<VMState::StackElement,_std::allocator<VMState::StackElement>_>::
               operator[](&this->m_Stack,pos);
      return &pvVar2->expression;
    }
  }
  this_00 = (Error *)__cxa_allocate_exception(0x28);
  Error::Error(this_00,"Accessing non valid stack position.");
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

ExpressionPtr& AtStack( int64_t pos )
	{
		if (pos < 0 || pos >= m_Stack.size())
			throw Error("Accessing non valid stack position.");

		return m_Stack[(size_t) pos].expression;
	}